

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_avx2.c
# Opt level: O0

void addsub_avx2(__m256i in0,__m256i in1,__m256i *out0,__m256i *out1,__m256i *clamp_lo,
                __m256i *clamp_hi)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 (*in_RCX) [32];
  undefined1 (*in_RDX) [32];
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  undefined8 in_YMM0_H;
  undefined8 in_register_00001218;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM1_Qb;
  undefined8 in_YMM1_H;
  undefined8 in_register_00001258;
  __m256i a1;
  __m256i a0;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  
  auVar2._8_8_ = in_XMM0_Qb;
  auVar2._0_8_ = in_XMM0_Qa;
  auVar2._16_8_ = in_YMM0_H;
  auVar2._24_8_ = in_register_00001218;
  auVar1._8_8_ = in_XMM1_Qb;
  auVar1._0_8_ = in_XMM1_Qa;
  auVar1._16_8_ = in_YMM1_H;
  auVar1._24_8_ = in_register_00001258;
  auVar1 = vpaddd_avx2(auVar2,auVar1);
  auVar4._8_8_ = in_XMM0_Qb;
  auVar4._0_8_ = in_XMM0_Qa;
  auVar4._16_8_ = in_YMM0_H;
  auVar4._24_8_ = in_register_00001218;
  auVar3._8_8_ = in_XMM1_Qb;
  auVar3._0_8_ = in_XMM1_Qa;
  auVar3._16_8_ = in_YMM1_H;
  auVar3._24_8_ = in_register_00001258;
  auVar3 = vpsubd_avx2(auVar4,auVar3);
  auVar1 = vpmaxsd_avx2(auVar1,*in_RDX);
  auVar2 = vpminsd_avx2(auVar1,*in_RCX);
  auVar1 = vpmaxsd_avx2(auVar3,*in_RDX);
  auVar1 = vpminsd_avx2(auVar1,*in_RCX);
  local_240 = auVar2._0_8_;
  uStack_238 = auVar2._8_8_;
  uStack_230 = auVar2._16_8_;
  uStack_228 = auVar2._24_8_;
  *in_RDI = local_240;
  in_RDI[1] = uStack_238;
  in_RDI[2] = uStack_230;
  in_RDI[3] = uStack_228;
  local_260 = auVar1._0_8_;
  uStack_258 = auVar1._8_8_;
  uStack_250 = auVar1._16_8_;
  uStack_248 = auVar1._24_8_;
  *in_RSI = local_260;
  in_RSI[1] = uStack_258;
  in_RSI[2] = uStack_250;
  in_RSI[3] = uStack_248;
  return;
}

Assistant:

static void addsub_avx2(const __m256i in0, const __m256i in1, __m256i *out0,
                        __m256i *out1, const __m256i *clamp_lo,
                        const __m256i *clamp_hi) {
  __m256i a0 = _mm256_add_epi32(in0, in1);
  __m256i a1 = _mm256_sub_epi32(in0, in1);

  a0 = _mm256_max_epi32(a0, *clamp_lo);
  a0 = _mm256_min_epi32(a0, *clamp_hi);
  a1 = _mm256_max_epi32(a1, *clamp_lo);
  a1 = _mm256_min_epi32(a1, *clamp_hi);

  *out0 = a0;
  *out1 = a1;
}